

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue JS_ToStringInternal(JSContext *ctx,JSValue val,BOOL is_ToPropertyKey)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  JSAtom atom;
  JSValueUnion d;
  char *str;
  JSValue JVar3;
  char buf [32];
  
  d = val.u;
  str = buf;
  switch((int)val.tag) {
  case 0:
    snprintf(buf,0x20,"%d",(ulong)d.ptr & 0xffffffff);
    break;
  case 1:
    atom = 3 - (val.u._0_4_ == 0);
    goto LAB_0011d1b3;
  case 2:
    atom = 1;
    goto LAB_0011d1b3;
  case 3:
    atom = 0x45;
LAB_0011d1b3:
    val = JS_AtomToString(ctx,atom);
    goto LAB_0011d258;
  case 6:
    uVar2 = val.tag & 0xffffffff;
LAB_0011d2a0:
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar2;
    val = (JSValue)(auVar1 << 0x40);
    uVar2 = 0;
    goto LAB_0011d26b;
  case 7:
    val = js_dtoa(ctx,d.float64,10,0,0);
    goto LAB_0011d258;
  case -8:
    if (is_ToPropertyKey == 0) {
      JS_ThrowTypeError(ctx,"cannot convert symbol to string");
      uVar2 = 6;
      goto LAB_0011d2a0;
    }
  case -7:
    *(int *)d.ptr = *d.ptr + 1;
LAB_0011d20f:
    uVar2 = (ulong)val.u.ptr & 0xffffffff00000000;
    goto LAB_0011d26b;
  default:
    str = "[unsupported type]";
    break;
  case -2:
    str = "[function bytecode]";
    break;
  case -1:
    JVar3 = JS_ToPrimitive(ctx,val,0);
    val = JVar3;
    if ((int)JVar3.tag != 6) {
      val = JS_ToStringInternal(ctx,JVar3,is_ToPropertyKey);
      JS_FreeValue(ctx,JVar3);
    }
    goto LAB_0011d20f;
  }
  val = JS_NewString(ctx,str);
LAB_0011d258:
  uVar2 = (ulong)val.u.ptr & 0xffffffff00000000;
LAB_0011d26b:
  JVar3.u.ptr = (void *)((ulong)val.u.ptr & 0xffffffff | uVar2);
  JVar3.tag = val.tag;
  return JVar3;
}

Assistant:

JSValue JS_ToStringInternal(JSContext *ctx, JSValueConst val, BOOL is_ToPropertyKey)
{
    uint32_t tag;
    const char *str;
    char buf[32];

    tag = JS_VALUE_GET_NORM_TAG(val);
    switch(tag) {
    case JS_TAG_STRING:
        return JS_DupValue(ctx, val);
    case JS_TAG_INT:
        snprintf(buf, sizeof(buf), "%d", JS_VALUE_GET_INT(val));
        str = buf;
        goto new_string;
    case JS_TAG_BOOL:
        return JS_AtomToString(ctx, JS_VALUE_GET_BOOL(val) ?
                          JS_ATOM_true : JS_ATOM_false);
    case JS_TAG_NULL:
        return JS_AtomToString(ctx, JS_ATOM_null);
    case JS_TAG_UNDEFINED:
        return JS_AtomToString(ctx, JS_ATOM_undefined);
    case JS_TAG_EXCEPTION:
        return JS_EXCEPTION;
    case JS_TAG_OBJECT:
        {
            JSValue val1, ret;
            val1 = JS_ToPrimitive(ctx, val, HINT_STRING);
            if (JS_IsException(val1))
                return val1;
            ret = JS_ToStringInternal(ctx, val1, is_ToPropertyKey);
            JS_FreeValue(ctx, val1);
            return ret;
        }
        break;
    case JS_TAG_FUNCTION_BYTECODE:
        str = "[function bytecode]";
        goto new_string;
    case JS_TAG_SYMBOL:
        if (is_ToPropertyKey) {
            return JS_DupValue(ctx, val);
        } else {
            return JS_ThrowTypeError(ctx, "cannot convert symbol to string");
        }
    case JS_TAG_FLOAT64:
        return js_dtoa(ctx, JS_VALUE_GET_FLOAT64(val), 10, 0,
                       JS_DTOA_VAR_FORMAT);
#ifdef CONFIG_BIGNUM
    case JS_TAG_BIG_INT:
        return ctx->rt->bigint_ops.to_string(ctx, val);
    case JS_TAG_BIG_FLOAT:
        return ctx->rt->bigfloat_ops.to_string(ctx, val);
    case JS_TAG_BIG_DECIMAL:
        return ctx->rt->bigdecimal_ops.to_string(ctx, val);
#endif
    default:
        str = "[unsupported type]";
    new_string:
        return JS_NewString(ctx, str);
    }
}